

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotErrorBarsHEx<ImPlot::GetterError<unsigned_long_long>>
               (char *label_id,GetterError<unsigned_long_long> *getter)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  ImPlotContext *pIVar3;
  bool bVar4;
  ImU32 col;
  long lVar5;
  ImDrawList *this;
  int iVar6;
  int iVar7;
  float fVar8;
  double dVar9;
  ImVec2 p1;
  ImVec2 p2;
  ImVec2 local_b8;
  ImPlotPoint local_b0;
  float local_9c;
  ImVec2 local_98;
  ImVec2 local_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  bVar4 = BeginItem(label_id,-1);
  if (bVar4) {
    if ((GImPlot->FitThisFrame == true) && (iVar6 = getter->Count, 0 < iVar6)) {
      iVar7 = 0;
      do {
        lVar5 = (long)(((getter->Offset + iVar7) % iVar6 + iVar6) % iVar6) * (long)getter->Stride;
        uVar1 = *(unsigned_long_long *)((long)getter->Xs + lVar5);
        dStack_70 = (double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25;
        local_78 = dStack_70 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        uVar1 = *(unsigned_long_long *)((long)getter->Ys + lVar5);
        dStack_80 = (double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25;
        local_b0.y = dStack_80 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        uVar1 = *(unsigned_long_long *)((long)getter->Neg + lVar5);
        uVar2 = *(unsigned_long_long *)((long)getter->Pos + lVar5);
        dVar9 = (double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25;
        local_68._8_4_ = SUB84(dVar9,0);
        local_68._0_8_ = dVar9 + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
        local_68._12_4_ = (int)((ulong)dVar9 >> 0x20);
        local_b0.x = local_78 -
                     (((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
        local_88 = local_b0.y;
        FitPoint(&local_b0);
        local_b0.x = (double)local_68._0_8_ + local_78;
        local_b0.y = local_88;
        FitPoint(&local_b0);
        iVar7 = iVar7 + 1;
        iVar6 = getter->Count;
      } while (iVar7 < iVar6);
    }
    pIVar3 = GImPlot;
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar3->NextItemData).Colors + 4);
    iVar6 = getter->Count;
    if (0 < iVar6) {
      local_9c = (pIVar3->NextItemData).ErrorBarSize;
      local_48 = ZEXT416((uint)(local_9c * 0.5));
      local_58 = ZEXT416((uint)(local_9c * 0.5)) << 0x20;
      iVar7 = 0;
      do {
        lVar5 = (long)(((getter->Offset + iVar7) % iVar6 + iVar6) % iVar6) * (long)getter->Stride;
        uVar1 = *(unsigned_long_long *)((long)getter->Xs + lVar5);
        dStack_70 = (double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25;
        local_78 = dStack_70 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        uVar1 = *(unsigned_long_long *)((long)getter->Ys + lVar5);
        dStack_80 = (double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25;
        local_88 = dStack_80 + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
        uVar1 = *(unsigned_long_long *)((long)getter->Neg + lVar5);
        uVar2 = *(unsigned_long_long *)((long)getter->Pos + lVar5);
        dVar9 = (double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25;
        local_68._8_4_ = SUB84(dVar9,0);
        local_68._0_8_ = dVar9 + ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
        local_68._12_4_ = (int)((ulong)dVar9 >> 0x20);
        local_b0.x = (double)PlotToPixels(local_78 -
                                          (((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) -
                                           1.9342813113834067e+25) +
                                          ((double)CONCAT44(0x43300000,(int)uVar1) -
                                          4503599627370496.0)),local_88,-1);
        local_90 = PlotToPixels((double)local_68._0_8_ + local_78,local_88,-1);
        ImDrawList::AddLine(this,(ImVec2 *)&local_b0,&local_90,col,
                            (pIVar3->NextItemData).ErrorBarWeight);
        if (0.0 < local_9c) {
          local_b8.x = SUB84(local_b0.x,0);
          fVar8 = (float)((ulong)local_b0.x >> 0x20);
          local_b8.y = fVar8 - (float)local_48._0_4_;
          local_98.y = (float)local_58._4_4_ + fVar8;
          local_98.x = (float)local_58._0_4_ + local_b8.x;
          ImDrawList::AddLine(this,&local_b8,&local_98,col,(pIVar3->NextItemData).ErrorBarWeight);
          local_b8.x = local_90.x;
          local_b8.y = local_90.y - (float)local_48._0_4_;
          local_98.y = (float)local_58._4_4_ + local_90.y;
          local_98.x = (float)local_58._0_4_ + local_b8.x;
          ImDrawList::AddLine(this,&local_b8,&local_98,col,(pIVar3->NextItemData).ErrorBarWeight);
        }
        iVar7 = iVar7 + 1;
        iVar6 = getter->Count;
      } while (iVar7 < iVar6);
    }
    pIVar3 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar3->NextItemData);
    pIVar3->PreviousItem = pIVar3->CurrentItem;
    pIVar3->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotErrorBarsHEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPointError e = getter(i);
                FitPoint(ImPlotPoint(e.X - e.Neg, e.Y));
                FitPoint(ImPlotPoint(e.X + e.Pos, e.Y));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        const ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_ErrorBar]);
        const bool rend_whisker  = s.ErrorBarSize > 0;
        const float half_whisker = s.ErrorBarSize * 0.5f;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPointError e = getter(i);
            ImVec2 p1 = PlotToPixels(e.X - e.Neg, e.Y);
            ImVec2 p2 = PlotToPixels(e.X + e.Pos, e.Y);
            DrawList.AddLine(p1, p2, col, s.ErrorBarWeight);
            if (rend_whisker) {
                DrawList.AddLine(p1 - ImVec2(0, half_whisker), p1 + ImVec2(0, half_whisker), col, s.ErrorBarWeight);
                DrawList.AddLine(p2 - ImVec2(0, half_whisker), p2 + ImVec2(0, half_whisker), col, s.ErrorBarWeight);
            }
        }
        EndItem();
    }
}